

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall tcu::Texture2D::Texture2D(Texture2D *this,Texture2D *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  Texture2D *other_local;
  Texture2D *this_local;
  
  TextureLevelPyramid::TextureLevelPyramid
            (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
  this->m_width = other->m_width;
  this->m_height = other->m_height;
  numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  Texture2DView::Texture2DView(&this->m_view,numLevels,levels);
  return;
}

Assistant:

Texture2D::Texture2D (const Texture2D& other)
	: TextureLevelPyramid	(other)
	, m_width				(other.m_width)
	, m_height				(other.m_height)
	, m_view				(getNumLevels(), getLevels())
{
}